

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form3_AbsoluteDifference(AbsoluteDifferenceForm3 AbsoluteDifference)

{
  byte bVar1;
  value_type vVar2;
  initializer_list<PenguinV_Image::ImageTemplate<unsigned_char>_> __l;
  bool bVar3;
  const_reference pvVar4;
  reference pvVar5;
  const_reference pvVar6;
  byte *pbVar7;
  code *in_RDI;
  Image output;
  uint32_t roiHeight;
  uint32_t roiWidth;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  value_type height;
  uint32_t in_stack_fffffffffffffd9c;
  uint8_t value;
  undefined2 in_stack_fffffffffffffda4;
  uint8_t in_stack_fffffffffffffda6;
  uint8_t in_stack_fffffffffffffda7;
  uint32_t in_stack_fffffffffffffda8;
  uint32_t in_stack_fffffffffffffdac;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffdb0;
  Image *in_stack_fffffffffffffdb8;
  uint32_t in_stack_fffffffffffffdc4;
  uint32_t in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *in_stack_fffffffffffffdd0;
  undefined2 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffdda;
  undefined1 in_stack_fffffffffffffddb;
  undefined4 in_stack_fffffffffffffddc;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  bool local_212;
  uint32_t *in_stack_fffffffffffffe00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  uint32_t *in_stack_fffffffffffffe08;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe10;
  size_type __n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  value_type vVar8;
  undefined4 in_stack_fffffffffffffe24;
  value_type vVar9;
  undefined1 **local_1a0;
  undefined1 local_170 [40];
  undefined4 local_148;
  undefined4 local_144;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_140;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_128;
  undefined1 local_109;
  undefined8 *local_a8;
  undefined1 *local_a0 [5];
  undefined1 local_78 [40];
  undefined8 *local_50;
  undefined8 local_48;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  code *local_10;
  
  local_10 = in_RDI;
  Unit_Test::intensityArray(in_stack_fffffffffffffd9c);
  local_109 = 1;
  local_a8 = local_a0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,0);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,in_stack_fffffffffffffda8,
             in_stack_fffffffffffffda7,in_stack_fffffffffffffda6);
  Test_Helper::uniformImage
            ((uint8_t)((uint)in_stack_fffffffffffffdcc >> 0x18),in_stack_fffffffffffffdc8,
             in_stack_fffffffffffffdc4,in_stack_fffffffffffffdb8);
  local_a8 = (undefined8 *)local_78;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,1);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,in_stack_fffffffffffffda8,
             in_stack_fffffffffffffda7,in_stack_fffffffffffffda6);
  Test_Helper::uniformImage
            ((uint8_t)((uint)in_stack_fffffffffffffdcc >> 0x18),in_stack_fffffffffffffdc8,
             in_stack_fffffffffffffdc4,in_stack_fffffffffffffdb8);
  local_109 = 0;
  local_50 = local_a0;
  local_48 = 2;
  std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>::allocator
            ((allocator<PenguinV_Image::ImageTemplate<unsigned_char>_> *)0x1cbe96);
  __l._M_array._2_1_ = in_stack_fffffffffffffdda;
  __l._M_array._0_2_ = in_stack_fffffffffffffdd8;
  __l._M_array._3_1_ = in_stack_fffffffffffffddb;
  __l._M_array._4_4_ = in_stack_fffffffffffffddc;
  __l._M_len._0_4_ = in_stack_fffffffffffffde0;
  __l._M_len._4_4_ = in_stack_fffffffffffffde4;
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::vector(in_stack_fffffffffffffdd0,__l,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>::~allocator
            ((allocator<PenguinV_Image::ImageTemplate<unsigned_char>_> *)0x1cbeca);
  local_1a0 = (undefined1 **)&local_50;
  do {
    local_1a0 = local_1a0 + -5;
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x1cbeff);
  } while (local_1a0 != local_a0);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1cbf29);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1cbf36);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1cbf4b);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1cbf60);
  Unit_Test::generateRoi
            ((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
              *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
             in_stack_fffffffffffffe00);
  pvVar4 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](&local_40,0);
  this = &local_128;
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this,0);
  vVar8 = *pvVar5;
  this_00 = &local_140;
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,0);
  vVar9 = *pvVar5;
  __n = 1;
  pvVar6 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](&local_40,1);
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this,__n);
  vVar2 = *pvVar5;
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,__n);
  height = *pvVar5;
  (*local_10)(local_170,pvVar4,vVar8,vVar9,pvVar6,vVar2,height,local_144,local_148);
  bVar3 = Unit_Test::equalSize
                    ((Image *)CONCAT17(in_stack_fffffffffffffda7,
                                       CONCAT16(in_stack_fffffffffffffda6,
                                                CONCAT24(in_stack_fffffffffffffda4,local_144))),
                     in_stack_fffffffffffffd9c,height);
  value = (uint8_t)(in_stack_fffffffffffffd9c >> 0x18);
  local_212 = false;
  if (bVar3) {
    pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,0);
    bVar1 = *pbVar7;
    pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,1);
    if (*pbVar7 < bVar1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,1);
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,0);
    }
    local_212 = Unit_Test::verifyImage
                          ((Image *)CONCAT17(in_stack_fffffffffffffda7,
                                             CONCAT16(in_stack_fffffffffffffda6,
                                                      CONCAT24(in_stack_fffffffffffffda4,local_144))
                                            ),value);
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1cc1bd);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffdb0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffdb0);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)in_stack_fffffffffffffdb0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdb0);
  return (bool)(local_212 & 1);
}

Assistant:

bool form3_AbsoluteDifference(AbsoluteDifferenceForm3 AbsoluteDifference)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const std::vector < PenguinV_Image::Image > input = { uniformImage( intensity[0] ), uniformImage( intensity[1] ) };

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        const PenguinV_Image::Image output = AbsoluteDifference( input[0], roiX[0], roiY[0], input[1], roiX[1], roiY[1], roiWidth, roiHeight );

        return equalSize( output, roiWidth, roiHeight ) &&
            verifyImage( output, static_cast<uint8_t>( intensity[0] > intensity[1] ? intensity[0] - intensity[1] : intensity[1] - intensity[0] ) );
    }